

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

RsCodeBlockSyntax * __thiscall slang::parsing::Parser::parseRsCodeBlock(Parser *this)

{
  Token closeBrace_00;
  Token openBrace_00;
  RsCodeBlockSyntax *pRVar1;
  SyntaxList<slang::syntax::SyntaxNode> *in_RDI;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> sVar2;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> items;
  Token closeBrace;
  Token openBrace;
  undefined1 in_stack_000001ff;
  Token *in_stack_00000200;
  TokenKind in_stack_0000020e;
  Parser *in_stack_00000210;
  SyntaxList<slang::syntax::SyntaxNode> *in_stack_ffffffffffffff48;
  SyntaxList<slang::syntax::SyntaxNode> *pSVar3;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff60;
  Info *local_38;
  undefined6 local_28;
  TokenKind in_stack_ffffffffffffffde;
  ParserBase *in_stack_ffffffffffffffe0;
  
  ParserBase::expect(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde);
  Token::Token((Token *)in_RDI);
  sVar2 = parseBlockItems(in_stack_00000210,in_stack_0000020e,in_stack_00000200,
                          (bool)in_stack_000001ff);
  pSVar3 = in_RDI + 4;
  local_38 = (Info *)sVar2._M_ptr;
  sVar2._M_extent._M_extent_value = in_stack_ffffffffffffff60._M_extent_value;
  sVar2._M_ptr = (pointer)pSVar3;
  slang::syntax::SyntaxList<slang::syntax::SyntaxNode>::SyntaxList(in_RDI,sVar2);
  closeBrace_00.info._6_2_ = in_stack_ffffffffffffffde;
  closeBrace_00.info._0_6_ = local_28;
  openBrace_00.info = local_38;
  openBrace_00._0_8_ = in_stack_ffffffffffffffe0;
  closeBrace_00._0_8_ = pSVar3;
  pRVar1 = slang::syntax::SyntaxFactory::rsCodeBlock
                     ((SyntaxFactory *)in_RDI,openBrace_00,in_stack_ffffffffffffff48,closeBrace_00);
  return pRVar1;
}

Assistant:

RsCodeBlockSyntax& Parser::parseRsCodeBlock() {
    auto openBrace = expect(TokenKind::OpenBrace);

    Token closeBrace;
    auto items = parseBlockItems(TokenKind::CloseBrace, closeBrace, /* inConstructor */ false);

    return factory.rsCodeBlock(openBrace, items, closeBrace);
}